

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O1

void __thiscall LASinterval::LASinterval(LASinterval *this,U32 threshold)

{
  long *plVar1;
  
  plVar1 = (long *)operator_new(0x38);
  *plVar1 = (long)(plVar1 + 6);
  plVar1[1] = 1;
  plVar1[2] = 0;
  plVar1[3] = 0;
  *(undefined4 *)(plVar1 + 4) = 0x3f800000;
  plVar1[5] = 0;
  plVar1[6] = 0;
  this->cells = plVar1;
  this->cells_to_merge = (void *)0x0;
  this->threshold = threshold;
  this->number_intervals = 0;
  this->last_index = -0x80000000;
  this->index = 0;
  this->start = 0;
  this->end = 0;
  this->full = 0;
  this->total = 0;
  *(undefined8 *)((long)&this->current_cell + 1) = 0;
  *(undefined8 *)((long)&this->merged_cells + 1) = 0;
  this->last_cell = (LASintervalStartCell *)0x0;
  this->current_cell = (LASintervalCell *)0x0;
  return;
}

Assistant:

LASinterval::LASinterval(const U32 threshold)
{
  cells = new my_cell_hash;
  cells_to_merge = 0;
  this->threshold = threshold;
  number_intervals = 0;
  last_index = I32_MIN;
  last_cell = 0;
  current_cell = 0;
  merged_cells = 0;
  merged_cells_temporary = FALSE;
  end = 0;
  full = 0;
  index = 0;
  start = 0;
  total = 0;
}